

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

void __thiscall Escape::CGraph::sortById(CGraph *this)

{
  VertexIdx *pVVar1;
  VertexIdx *pVVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  
  if (0 < this->nVertices) {
    lVar6 = 0;
    do {
      lVar3 = this->offsets[lVar6];
      lVar4 = this->offsets[lVar6 + 1];
      if (lVar3 != lVar4) {
        pVVar1 = this->nbors + lVar4;
        pVVar2 = this->nbors + lVar3;
        uVar5 = lVar4 * 8 + lVar3 * -8 >> 3;
        lVar3 = 0x3f;
        if (uVar5 != 0) {
          for (; uVar5 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        std::__introsort_loop<long*,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (pVVar2,pVVar1,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
        std::__final_insertion_sort<long*,__gnu_cxx::__ops::_Iter_less_iter>(pVVar2,pVVar1);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < this->nVertices);
  }
  return;
}

Assistant:

void CGraph::sortById() const {
    for (VertexIdx i = 0; i < nVertices; i++)
        std::sort(nbors + offsets[i], nbors + offsets[i + 1]);
}